

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_257,_true,_embree::avx512::VirtualCurveIntersectorK<8>,_true>::
     intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  anon_union_32_3_898e2e57_for_vint_impl<8>_1 aVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  BVH *bvh;
  bool bVar4;
  undefined1 auVar5 [32];
  ulong uVar6;
  undefined8 uVar7;
  size_t k;
  ulong uVar8;
  long lVar9;
  undefined8 unaff_RBX;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar13 [16];
  undefined1 auVar16 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [32];
  undefined1 auVar17 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar19 [64];
  float fVar20;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar21 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar22 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  vfloat4 a0;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  Precalculations pre;
  TravRayK<8,_true> tray;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_3c0;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  undefined1 auStack_380 [352];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_220;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  int local_100;
  int iStack_fc;
  int iStack_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int iStack_e8;
  int iStack_e4;
  undefined1 local_e0 [32];
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    aVar1 = valid_i->field_0;
    auVar5 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar7 = vpcmpeqd_avx512vl((undefined1  [32])aVar1,auVar5);
    if ((byte)uVar7 != 0) {
      uVar10 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),(uint)(byte)uVar7);
      auVar5 = *(undefined1 (*) [32])(ray + 0x80);
      auVar2 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar3 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar19._0_4_ = auVar3._0_4_ * auVar3._0_4_;
      auVar19._4_4_ = auVar3._4_4_ * auVar3._4_4_;
      auVar19._8_4_ = auVar3._8_4_ * auVar3._8_4_;
      auVar19._12_4_ = auVar3._12_4_ * auVar3._12_4_;
      auVar19._16_4_ = auVar3._16_4_ * auVar3._16_4_;
      auVar19._20_4_ = auVar3._20_4_ * auVar3._20_4_;
      auVar19._28_36_ = in_ZMM4._28_36_;
      auVar19._24_4_ = auVar3._24_4_ * auVar3._24_4_;
      auVar29 = vfmadd231ps_fma(auVar19._0_32_,auVar2,auVar2);
      auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar5,auVar5);
      auVar14 = vrsqrt14ps_avx512vl(ZEXT1632(auVar29));
      auVar15._8_4_ = 0xbf000000;
      auVar15._0_8_ = 0xbf000000bf000000;
      auVar15._12_4_ = 0xbf000000;
      auVar15._16_4_ = 0xbf000000;
      auVar15._20_4_ = 0xbf000000;
      auVar15._24_4_ = 0xbf000000;
      auVar15._28_4_ = 0xbf000000;
      auVar15 = vmulps_avx512vl(ZEXT1632(auVar29),auVar15);
      fVar20 = auVar14._0_4_;
      fVar23 = auVar14._4_4_;
      fVar24 = auVar14._8_4_;
      fVar25 = auVar14._12_4_;
      fVar26 = auVar14._16_4_;
      fVar27 = auVar14._20_4_;
      fVar28 = auVar14._24_4_;
      auVar29._0_4_ = fVar20 * fVar20;
      auVar29._4_4_ = fVar23 * fVar23;
      auVar29._8_4_ = fVar24 * fVar24;
      auVar29._12_4_ = fVar25 * fVar25;
      auVar18._4_4_ = auVar29._4_4_ * fVar23 * auVar15._4_4_;
      auVar18._0_4_ = auVar29._0_4_ * fVar20 * auVar15._0_4_;
      auVar18._8_4_ = auVar29._8_4_ * fVar24 * auVar15._8_4_;
      auVar18._12_4_ = auVar29._12_4_ * fVar25 * auVar15._12_4_;
      auVar18._16_4_ = fVar26 * fVar26 * fVar26 * auVar15._16_4_;
      auVar18._20_4_ = fVar27 * fVar27 * fVar27 * auVar15._20_4_;
      auVar18._24_4_ = fVar28 * fVar28 * fVar28 * auVar15._24_4_;
      auVar18._28_4_ = auVar15._28_4_;
      auVar16._8_4_ = 0x3fc00000;
      auVar16._0_8_ = 0x3fc000003fc00000;
      auVar16._12_4_ = 0x3fc00000;
      auVar16._16_4_ = 0x3fc00000;
      auVar16._20_4_ = 0x3fc00000;
      auVar16._24_4_ = 0x3fc00000;
      auVar16._28_4_ = 0x3fc00000;
      local_3c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                  vfmadd231ps_avx512vl(auVar18,auVar14,auVar16);
      auVar17._8_4_ = 0x80000000;
      auVar17._0_8_ = 0x8000000080000000;
      auVar17._12_4_ = 0x80000000;
      auVar21._12_4_ = 0;
      auVar21._0_12_ = ZEXT812(0);
      auVar21 = auVar21 << 0x20;
      auVar29 = vpcmpeqd_avx(auVar29,auVar29);
      uVar8 = uVar10;
      do {
        lVar9 = 0;
        for (uVar11 = uVar8; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
          lVar9 = lVar9 + 1;
        }
        uVar11 = (ulong)(uint)((int)lVar9 * 4);
        auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar11 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar11 + 0xa0)),0x1c);
        fVar20 = *(float *)((long)&local_3c0 + uVar11);
        auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + uVar11 + 0xc0)),0x28);
        auVar31._0_4_ = auVar12._0_4_ * fVar20;
        auVar31._4_4_ = auVar12._4_4_ * fVar20;
        auVar31._8_4_ = auVar12._8_4_ * fVar20;
        auVar31._12_4_ = auVar12._12_4_ * fVar20;
        auVar12 = vshufpd_avx(auVar31,auVar31,1);
        auVar32 = vmovshdup_avx(auVar31);
        auVar33 = vunpckhps_avx(auVar31,auVar21);
        auVar13._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
        auVar13._8_8_ = auVar12._8_8_ ^ auVar17._8_8_;
        auVar13 = vinsertps_avx(auVar13,auVar31,0x2a);
        auVar12 = vdpps_avx(auVar13,auVar13,0x7f);
        auVar33 = vshufps_avx(auVar33,ZEXT416(auVar32._0_4_ ^ 0x80000000),0x41);
        auVar32 = vdpps_avx(auVar33,auVar33,0x7f);
        uVar7 = vcmpps_avx512vl(auVar12,auVar32,1);
        auVar12 = vpmovm2d_avx512vl(uVar7);
        auVar35._0_4_ = auVar12._0_4_;
        auVar35._4_4_ = auVar35._0_4_;
        auVar35._8_4_ = auVar35._0_4_;
        auVar35._12_4_ = auVar35._0_4_;
        uVar11 = vpmovd2m_avx512vl(auVar35);
        auVar12._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar29._4_4_;
        auVar12._0_4_ = (uint)((byte)uVar11 & 1) * auVar29._0_4_;
        auVar12._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar29._8_4_;
        auVar12._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar29._12_4_;
        auVar12 = vblendvps_avx(auVar13,auVar33,auVar12);
        auVar32 = vdpps_avx(auVar12,auVar12,0x7f);
        auVar13 = vrsqrt14ss_avx512f(auVar21,ZEXT416((uint)auVar32._0_4_));
        fVar23 = auVar13._0_4_;
        fVar23 = fVar23 * 1.5 - auVar32._0_4_ * 0.5 * fVar23 * fVar23 * fVar23;
        auVar33._0_4_ = auVar12._0_4_ * fVar23;
        auVar33._4_4_ = auVar12._4_4_ * fVar23;
        auVar33._8_4_ = auVar12._8_4_ * fVar23;
        auVar33._12_4_ = auVar12._12_4_ * fVar23;
        auVar12 = vshufps_avx(auVar33,auVar33,0xc9);
        auVar32 = vshufps_avx(auVar31,auVar31,0xc9);
        auVar36._0_4_ = auVar33._0_4_ * auVar32._0_4_;
        auVar36._4_4_ = auVar33._4_4_ * auVar32._4_4_;
        auVar36._8_4_ = auVar33._8_4_ * auVar32._8_4_;
        auVar36._12_4_ = auVar33._12_4_ * auVar32._12_4_;
        auVar12 = vfmsub231ps_fma(auVar36,auVar31,auVar12);
        lVar9 = lVar9 * 0x30;
        auVar32 = vshufps_avx(auVar12,auVar12,0xc9);
        auVar12 = vdpps_avx(auVar32,auVar32,0x7f);
        uVar8 = uVar8 - 1 & uVar8;
        auVar13 = vrsqrt14ss_avx512f(auVar21,ZEXT416((uint)auVar12._0_4_));
        fVar23 = auVar13._0_4_;
        fVar23 = fVar23 * 1.5 - auVar12._0_4_ * 0.5 * fVar23 * fVar23 * fVar23;
        auVar34._0_4_ = fVar23 * auVar32._0_4_;
        auVar34._4_4_ = fVar23 * auVar32._4_4_;
        auVar34._8_4_ = fVar23 * auVar32._8_4_;
        auVar34._12_4_ = fVar23 * auVar32._12_4_;
        auVar32._0_4_ = fVar20 * auVar31._0_4_;
        auVar32._4_4_ = fVar20 * auVar31._4_4_;
        auVar32._8_4_ = fVar20 * auVar31._8_4_;
        auVar32._12_4_ = fVar20 * auVar31._12_4_;
        auVar13 = vunpcklps_avx(auVar33,auVar32);
        auVar12 = vunpckhps_avx(auVar33,auVar32);
        auVar33 = vunpcklps_avx(auVar34,auVar21);
        auVar32 = vunpckhps_avx(auVar34,auVar21);
        auVar32 = vunpcklps_avx(auVar12,auVar32);
        auVar31 = vunpcklps_avx(auVar13,auVar33);
        auVar12 = vunpckhps_avx(auVar13,auVar33);
        *(undefined1 (*) [16])(local_3a0 + lVar9) = auVar31;
        *(undefined1 (*) [16])(auStack_390 + lVar9) = auVar12;
        *(undefined1 (*) [16])(auStack_380 + lVar9) = auVar32;
      } while (uVar8 != 0);
      local_220._0_8_ = *(undefined8 *)ray;
      local_220._8_8_ = *(undefined8 *)(ray + 8);
      local_220._16_8_ = *(undefined8 *)(ray + 0x10);
      local_220._24_8_ = *(undefined8 *)(ray + 0x18);
      local_220._32_8_ = *(undefined8 *)(ray + 0x20);
      local_220._40_8_ = *(undefined8 *)(ray + 0x28);
      local_220._48_8_ = *(undefined8 *)(ray + 0x30);
      local_220._56_8_ = *(undefined8 *)(ray + 0x38);
      local_220._64_8_ = *(undefined8 *)(ray + 0x40);
      local_220._72_8_ = *(undefined8 *)(ray + 0x48);
      local_220._80_8_ = *(undefined8 *)(ray + 0x50);
      local_220._88_8_ = *(undefined8 *)(ray + 0x58);
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar14._16_4_ = 0x7fffffff;
      auVar14._20_4_ = 0x7fffffff;
      auVar14._24_4_ = 0x7fffffff;
      auVar14._28_4_ = 0x7fffffff;
      auVar15 = vandps_avx(auVar5,auVar14);
      auVar30._8_4_ = 0x219392ef;
      auVar30._0_8_ = 0x219392ef219392ef;
      auVar30._12_4_ = 0x219392ef;
      auVar30._16_4_ = 0x219392ef;
      auVar30._20_4_ = 0x219392ef;
      auVar30._24_4_ = 0x219392ef;
      auVar30._28_4_ = 0x219392ef;
      uVar8 = vcmpps_avx512vl(auVar15,auVar30,1);
      auVar22._8_4_ = 0x3f800000;
      auVar22._0_8_ = 0x3f8000003f800000;
      auVar22._12_4_ = 0x3f800000;
      auVar22._16_4_ = 0x3f800000;
      auVar22._20_4_ = 0x3f800000;
      auVar22._24_4_ = 0x3f800000;
      auVar22._28_4_ = 0x3f800000;
      auVar15 = vandps_avx(auVar2,auVar14);
      uVar11 = vcmpps_avx512vl(auVar15,auVar30,1);
      auVar16 = vdivps_avx(auVar22,auVar5);
      auVar18 = vdivps_avx(auVar22,auVar2);
      auVar15 = vandps_avx(auVar3,auVar14);
      uVar6 = vcmpps_avx512vl(auVar15,auVar30,1);
      auVar15 = vdivps_avx(auVar22,auVar3);
      bVar4 = (bool)((byte)uVar8 & 1);
      local_160._0_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar16._0_4_;
      bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
      local_160._4_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar16._4_4_;
      bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
      local_160._8_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar16._8_4_;
      bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
      local_160._12_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar16._12_4_;
      bVar4 = (bool)((byte)(uVar8 >> 4) & 1);
      local_160._16_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar16._16_4_;
      bVar4 = (bool)((byte)(uVar8 >> 5) & 1);
      local_160._20_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar16._20_4_;
      bVar4 = (bool)((byte)(uVar8 >> 6) & 1);
      local_160._24_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar16._24_4_;
      bVar4 = SUB81(uVar8 >> 7,0);
      local_160._28_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar16._28_4_;
      bVar4 = (bool)((byte)uVar11 & 1);
      local_140._0_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar18._0_4_;
      bVar4 = (bool)((byte)(uVar11 >> 1) & 1);
      local_140._4_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar18._4_4_;
      bVar4 = (bool)((byte)(uVar11 >> 2) & 1);
      local_140._8_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar18._8_4_;
      bVar4 = (bool)((byte)(uVar11 >> 3) & 1);
      local_140._12_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar18._12_4_;
      bVar4 = (bool)((byte)(uVar11 >> 4) & 1);
      local_140._16_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar18._16_4_;
      bVar4 = (bool)((byte)(uVar11 >> 5) & 1);
      local_140._20_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar18._20_4_;
      bVar4 = (bool)((byte)(uVar11 >> 6) & 1);
      local_140._24_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar18._24_4_;
      bVar4 = SUB81(uVar11 >> 7,0);
      local_140._28_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar18._28_4_;
      bVar4 = (bool)((byte)uVar6 & 1);
      local_120._0_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar15._0_4_;
      bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
      local_120._4_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar15._4_4_;
      bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
      local_120._8_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar15._8_4_;
      bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
      local_120._12_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar15._12_4_;
      bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
      local_120._16_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar15._16_4_;
      bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
      local_120._20_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar15._20_4_;
      bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
      local_120._24_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar15._24_4_;
      bVar4 = SUB81(uVar6 >> 7,0);
      local_120._28_4_ = (uint)bVar4 * 0x5d5e0b6b | (uint)!bVar4 * auVar15._28_4_;
      uVar8 = vcmpps_avx512vl(local_160,ZEXT832(0) << 0x20,1);
      auVar15 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_100 = (uint)((byte)uVar8 & 1) * auVar15._0_4_;
      iStack_fc = (uint)((byte)(uVar8 >> 1) & 1) * auVar15._4_4_;
      iStack_f8 = (uint)((byte)(uVar8 >> 2) & 1) * auVar15._8_4_;
      iStack_f4 = (uint)((byte)(uVar8 >> 3) & 1) * auVar15._12_4_;
      iStack_f0 = (uint)((byte)(uVar8 >> 4) & 1) * auVar15._16_4_;
      iStack_ec = (uint)((byte)(uVar8 >> 5) & 1) * auVar15._20_4_;
      iStack_e8 = (uint)((byte)(uVar8 >> 6) & 1) * auVar15._24_4_;
      iStack_e4 = (uint)(byte)(uVar8 >> 7) * auVar15._28_4_;
      uVar8 = vcmpps_avx512vl(local_140,ZEXT832(0) << 0x20,5);
      auVar15 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar4 = (bool)((byte)uVar8 & 1);
      local_e0._0_4_ = (uint)bVar4 * auVar15._0_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
      local_e0._4_4_ = (uint)bVar4 * auVar15._4_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
      local_e0._8_4_ = (uint)bVar4 * auVar15._8_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
      local_e0._12_4_ = (uint)bVar4 * auVar15._12_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar8 >> 4) & 1);
      local_e0._16_4_ = (uint)bVar4 * auVar15._16_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar8 >> 5) & 1);
      local_e0._20_4_ = (uint)bVar4 * auVar15._20_4_ | (uint)!bVar4 * 0x60;
      bVar4 = (bool)((byte)(uVar8 >> 6) & 1);
      local_e0._24_4_ = (uint)bVar4 * auVar15._24_4_ | (uint)!bVar4 * 0x60;
      bVar4 = SUB81(uVar8 >> 7,0);
      local_e0._28_4_ = (uint)bVar4 * auVar15._28_4_ | (uint)!bVar4 * 0x60;
      auVar15 = vpcmpeqd_avx2(local_e0,local_e0);
      auVar18 = ZEXT832(0) << 0x20;
      uVar8 = vcmpps_avx512vl(local_120,auVar18,5);
      auVar16 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar4 = (bool)((byte)uVar8 & 1);
      local_c0 = (uint)bVar4 * auVar16._0_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
      uStack_bc = (uint)bVar4 * auVar16._4_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
      uStack_b8 = (uint)bVar4 * auVar16._8_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
      uStack_b4 = (uint)bVar4 * auVar16._12_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar8 >> 4) & 1);
      uStack_b0 = (uint)bVar4 * auVar16._16_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar8 >> 5) & 1);
      uStack_ac = (uint)bVar4 * auVar16._20_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = (bool)((byte)(uVar8 >> 6) & 1);
      uStack_a8 = (uint)bVar4 * auVar16._24_4_ | (uint)!bVar4 * 0xa0;
      bVar4 = SUB81(uVar8 >> 7,0);
      uStack_a4 = (uint)bVar4 * auVar16._28_4_ | (uint)!bVar4 * 0xa0;
      uVar8 = vpcmpeqd_avx512vl((undefined1  [32])aVar1,auVar15);
      auVar15 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar18);
      bVar4 = (bool)((byte)uVar8 & 1);
      local_a0 = (uint)bVar4 * auVar15._0_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
      uStack_9c = (uint)bVar4 * auVar15._4_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
      uStack_98 = (uint)bVar4 * auVar15._8_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
      uStack_94 = (uint)bVar4 * auVar15._12_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar8 >> 4) & 1);
      uStack_90 = (uint)bVar4 * auVar15._16_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar8 >> 5) & 1);
      uStack_8c = (uint)bVar4 * auVar15._20_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar8 >> 6) & 1);
      uStack_88 = (uint)bVar4 * auVar15._24_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = SUB81(uVar8 >> 7,0);
      uStack_84 = (uint)bVar4 * auVar15._28_4_ | (uint)!bVar4 * 0x7f800000;
      auVar15 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar18);
      bVar4 = (bool)((byte)uVar8 & 1);
      local_80 = (uint)bVar4 * auVar15._0_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar8 >> 1) & 1);
      uStack_7c = (uint)bVar4 * auVar15._4_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
      uStack_78 = (uint)bVar4 * auVar15._8_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar8 >> 3) & 1);
      uStack_74 = (uint)bVar4 * auVar15._12_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar8 >> 4) & 1);
      uStack_70 = (uint)bVar4 * auVar15._16_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar8 >> 5) & 1);
      uStack_6c = (uint)bVar4 * auVar15._20_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = (bool)((byte)(uVar8 >> 6) & 1);
      uStack_68 = (uint)bVar4 * auVar15._24_4_ | (uint)!bVar4 * -0x800000;
      bVar4 = SUB81(uVar8 >> 7,0);
      uStack_64 = (uint)bVar4 * auVar15._28_4_ | (uint)!bVar4 * -0x800000;
      local_1c0 = auVar5;
      local_1a0 = auVar2;
      local_180 = auVar3;
      do {
        k = 0;
        for (uVar8 = uVar10; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
          k = k + 1;
        }
        intersect1(This,bvh,(NodeRef)(bvh->root).ptr,k,(Precalculations *)&local_3c0,ray,
                   (TravRayK<8,_true> *)&local_220.field_0,context);
        uVar10 = uVar10 - 1 & uVar10;
      } while (uVar10 != 0);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }